

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

uint pageant_client_op_query(PageantClientOp *pco)

{
  BinarySource *src;
  ulong uVar1;
  size_t sVar2;
  byte bVar3;
  uint uVar4;
  PageantAsyncOp *pPVar5;
  ptrlen pVar6;
  PageantClientRequestId reqid;
  PageantInternalClient pic;
  PageantClientRequestId local_4c;
  strbuf *local_48;
  char local_40;
  PageantClient local_38;
  
  if (pco->request_made == true) {
    __assert_fail("!pco->request_made",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",
                  0x700,"unsigned int pageant_client_op_query(PageantClientOp *)");
  }
  pco->request_made = true;
  if (pageant_local == '\0') {
    agent_query_synchronous(pco->buf,&local_48,&local_4c.unused_);
    strbuf_shrink_to(pco->buf,0);
    BinarySink_put_data(pco->buf->binarysink_,local_48,(long)local_4c.unused_);
    safefree(local_48);
    src = pco->binarysource_;
    sVar2 = pco->buf->len;
    pco->binarysource_[0].data = pco->buf->u;
    pco->binarysource_[0].len = sVar2;
    pco->binarysource_[0].pos = 0;
    pco->binarysource_[0].err = BSE_NO_ERROR;
    pco->binarysource_[0].binarysource_ = src;
    pVar6 = BinarySource_get_string(src);
    pco->binarysource_[0].data = pVar6.ptr;
    pco->binarysource_[0].len = pVar6.len;
    pco->binarysource_[0].pos = 0;
    pco->binarysource_[0].err = BSE_NO_ERROR;
    pco->binarysource_[0].binarysource_ = src;
  }
  else {
    local_38.vt = &internal_clientvt;
    local_38.suppress_logging = true;
    local_48 = pco->buf;
    local_40 = '\0';
    local_38.info = (PageantClientInfo *)safemalloc(1,0x18,0);
    (local_38.info)->pc = &local_38;
    ((local_38.info)->head).next = &(local_38.info)->head;
    ((local_38.info)->head).prev = &(local_38.info)->head;
    uVar1 = pco->buf->len;
    if (uVar1 < 5) {
      __assert_fail("pco->buf->len > 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",
                    0x71b,"unsigned int pageant_client_op_query(PageantClientOp *)");
    }
    pVar6.ptr = pco->buf->s + 4;
    pVar6.len = uVar1 - 4;
    pPVar5 = pageant_make_op(&local_38,&local_4c,pVar6);
    if (local_40 == '\0') {
      do {
        (*pPVar5->vt->coroutine)(pPVar5);
      } while (local_40 != '\x01');
    }
    pageant_unregister_client(&local_38);
    sVar2 = pco->buf->len;
    pco->binarysource_[0].data = pco->buf->u;
    pco->binarysource_[0].len = sVar2;
    pco->binarysource_[0].pos = 0;
    pco->binarysource_[0].err = BSE_NO_ERROR;
    pco->binarysource_[0].binarysource_ = pco->binarysource_;
  }
  bVar3 = BinarySource_get_byte(pco->binarysource_);
  uVar4 = 0x100;
  if (pco->binarysource_[0].err == BSE_NO_ERROR) {
    uVar4 = (uint)bVar3;
  }
  return uVar4;
}

Assistant:

static unsigned pageant_client_op_query(PageantClientOp *pco)
{
    /* Since we use the same strbuf for the request and the response,
     * check by assertion that we aren't embarrassingly sending a
     * previous response back to the agent */
    assert(!pco->request_made);
    pco->request_made = true;

    if (!pageant_local) {
        void *response_raw;
        int resplen_raw;
        agent_query_synchronous(pco->buf, &response_raw, &resplen_raw);
        strbuf_clear(pco->buf);
        put_data(pco->buf, response_raw, resplen_raw);
        sfree(response_raw);

        /* The data coming back from agent_query_synchronous will have
         * its length field prepended. So we start by parsing it as an
         * SSH-formatted string, and then reinitialise our
         * BinarySource with the interior of that string. */
        BinarySource_INIT_PL(pco, ptrlen_from_strbuf(pco->buf));
        BinarySource_INIT_PL(pco, get_string(pco));
    } else {
        PageantInternalClient pic;
        PageantClientRequestId reqid;

        pic.pc.vt = &internal_clientvt;
        pic.pc.suppress_logging = true;
        pic.response = pco->buf;
        pic.got_response = false;
        pageant_register_client(&pic.pc);

        assert(pco->buf->len > 4);
        PageantAsyncOp *pao = pageant_make_op(
            &pic.pc, &reqid, make_ptrlen(pco->buf->s + 4, pco->buf->len - 4));
        while (!pic.got_response)
            pageant_async_op_coroutine(pao);

        pageant_unregister_client(&pic.pc);

        BinarySource_INIT_PL(pco, ptrlen_from_strbuf(pco->buf));
    }

    /* Strip off and directly return the type byte, which every client
     * will need, to save a boilerplate get_byte at each call site */
    unsigned reply_type = get_byte(pco);
    if (get_err(pco))
        reply_type = 256;              /* out-of-range code */
    return reply_type;
}